

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  CMUnitTest tests [13];
  undefined1 auStackY_218 [128];
  CMFixtureFunction in_stack_fffffffffffffe68;
  CMFixtureFunction in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  CMUnitTest *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  
  memcpy(auStackY_218,&PTR_anon_var_dwarf_2b_00195a70,0x208);
  iVar1 = _cmocka_run_group_tests
                    (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  return iVar1;
}

Assistant:

int main() {
    const struct CMUnitTest tests[] = {
        cmocka_unit_test(test_art_simple),
        cmocka_unit_test(test_art_erase_all),
        cmocka_unit_test(test_art_is_empty),
        cmocka_unit_test(test_art_iterator_next),
        cmocka_unit_test(test_art_iterator_prev),
        cmocka_unit_test(test_art_iterator_lower_bound),
        cmocka_unit_test(test_art_lower_bound),
        cmocka_unit_test(test_art_upper_bound),
        cmocka_unit_test(test_art_iterator_erase),
        cmocka_unit_test(test_art_iterator_insert),
        cmocka_unit_test(test_art_shadowed),
        cmocka_unit_test(test_art_shrink_grow_node48),
        cmocka_unit_test(test_art_frozen_view),
    };
    return cmocka_run_group_tests(tests, NULL, NULL);
}